

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

bool wasm::ExpressionAnalyzer::shallowEqual(Expression *left,Expression *right)

{
  bool bVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_18 = std::
             _Function_handler<bool_(wasm::Expression_*,_wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/utils.h:74:21)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(wasm::Expression_*,_wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/utils.h:74:21)>
             ::_M_manager;
  local_30._M_unused._M_object = left;
  local_30._8_8_ = right;
  bVar1 = flexibleEqual(left,right,(ExprComparer *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return bVar1;
}

Assistant:

static bool shallowEqual(Expression* left, Expression* right) {
    auto comparer = [left, right](Expression* currLeft, Expression* currRight) {
      if (currLeft == left && currRight == right) {
        // these are the ones we want to compare
        return false;
      }
      // otherwise, don't do the comparison, we don't care
      return true;
    };
    return flexibleEqual(left, right, comparer);
  }